

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOWrite(char *filename,char *protocol,FmsDataCollection dc)

{
  int iVar1;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  FmsInt fms_format_version;
  FmsIOFunctions io;
  FmsIOContext ctx;
  FmsIOFunctions local_c0;
  FmsIOContext local_40;
  char *local_18;
  char *local_10;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else {
    local_18 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_18 = "ascii";
    }
    if (in_RDX == 0) {
      local_4 = 3;
    }
    else {
      local_10 = in_RDI;
      FmsIOContextInitialize((FmsIOContext *)0x1196bc);
      FmsIOFunctionsInitialize(&local_c0);
      iVar1 = (*local_c0.open)(&local_40,local_10,"wt");
      if (iVar1 == 0) {
        iVar1 = (*local_c0.add_int)(&local_40,"FMS",100);
        if (iVar1 == 0) {
          iVar1 = FmsIOWriteFmsDataCollection
                            ((FmsIOContext *)io.add_int,(FmsIOFunctions *)io.close,(char *)io.open,
                             (FmsDataCollection)fms_format_version);
          if (iVar1 == 0) {
            iVar1 = (*local_c0.close)(&local_40);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              local_4 = 8;
            }
          }
          else {
            (*local_c0.close)(&local_40);
            local_4 = 7;
          }
        }
        else {
          (*local_c0.close)(&local_40);
          local_4 = 6;
        }
      }
      else {
        local_4 = 5;
      }
    }
  }
  return local_4;
}

Assistant:

int
FmsIOWrite(const char *filename, const char *protocol, FmsDataCollection dc) {
  FmsIOContext ctx;
  FmsIOFunctions io;

  if(filename == NULL) E_RETURN(1);
  if(protocol == NULL) protocol = "ascii";
  if(!dc) E_RETURN(3);

#ifdef FMS_HAVE_CONDUIT
  int isSupported = CheckProtocolSupportConduit(protocol);
  if(isSupported == 1) {
    FmsIOContextInitializeConduit(&ctx, protocol);
    FmsIOFunctionsInitializeConduit(&io);
  } else if(isSupported == 2) {
    FmsIOContextInitialize(&ctx);
    FmsIOFunctionsInitialize(&io);
  } else if(isSupported == 0) {
    // fprintf(stderr, "The protocol %s is not supported by this Conduit runtime.", protocol);
    return 2;
  } else {
    E_RETURN(4);
  }
#else
  FmsIOContextInitialize(&ctx);
  FmsIOFunctionsInitialize(&io);
#endif

  /* "open" the file. */
  if((*io.open)(&ctx, filename, "wt") == 0) {
    // FMS format version of this writer: 100 = v0.1
    const FmsInt fms_format_version = 100;
    if((*io.add_int)(&ctx, "FMS", fms_format_version) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(6);
    }

    if(FmsIOWriteFmsDataCollection(&ctx, &io, "DataCollection", dc) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(7);
    }

    if((*io.close)(&ctx) != 0)
      E_RETURN(8);
  } else {
    E_RETURN(5);
  }

  return 0;
}